

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

string * __thiscall
benchmark::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,benchmark *this,char *flag)

{
  int iVar1;
  long lVar2;
  long local_78;
  size_t i;
  string env_var;
  allocator local_39;
  string local_38 [8];
  string flag_str;
  char *flag_local;
  
  flag_str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)this,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string((string *)&i);
  local_78 = 0;
  while( true ) {
    lVar2 = std::__cxx11::string::length();
    if (local_78 == lVar2) break;
    lVar2 = std::__cxx11::string::c_str();
    iVar1 = toupper((int)*(char *)(lVar2 + local_78));
    std::__cxx11::string::operator+=((string *)&i,(char)iVar1);
    local_78 = local_78 + 1;
  }
  std::operator+(__return_storage_ptr__,"BENCHMARK_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string flag_str(flag);

  std::string env_var;
  for (size_t i = 0; i != flag_str.length(); ++i)
    env_var += static_cast<char>(::toupper(flag_str.c_str()[i]));

  return "BENCHMARK_" + env_var;
}